

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O3

drmModeAtomicReq * __thiscall QKmsDevice::threadLocalAtomicRequest(QKmsDevice *this)

{
  long *plVar1;
  undefined8 *puVar2;
  drmModeAtomicReq *pdVar3;
  
  if (this->m_has_atomic_support == true) {
    puVar2 = (undefined8 *)QThreadStorageData::get();
    if (puVar2 == (undefined8 *)0x0) {
      puVar2 = (undefined8 *)operator_new(0x10);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)QThreadStorageData::set(&this->m_atomicReqs);
    }
    plVar1 = (long *)*puVar2;
    pdVar3 = (drmModeAtomicReq *)*plVar1;
    if (pdVar3 == (drmModeAtomicReq *)0x0) {
      pdVar3 = (drmModeAtomicReq *)drmModeAtomicAlloc();
      *plVar1 = (long)pdVar3;
    }
    return pdVar3;
  }
  return (drmModeAtomicReq *)0x0;
}

Assistant:

drmModeAtomicReq *QKmsDevice::threadLocalAtomicRequest()
{
    if (!m_has_atomic_support)
        return nullptr;

    AtomicReqs &a(m_atomicReqs.localData());
    if (!a.request)
        a.request = drmModeAtomicAlloc();

    return a.request;
}